

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O3

void __thiscall CLI::detail::IPV4Validator::IPV4Validator(IPV4Validator *this)

{
  anon_class_1_0_00000001 local_39;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"IPV4","");
  Validator::Validator(&this->super_Validator,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
             ,&local_39);
  return;
}

Assistant:

IPV4Validator() : Validator("IPV4") {
        func_ = [](std::string &ip_addr) {
            auto result = CLI::detail::split(ip_addr, '.');
            if(result.size() != 4) {
                return std::string("Invalid IPV4 address must have four parts (") + ip_addr + ')';
            }
            int num;
            for(const auto &var : result) {
                bool retval = detail::lexical_cast(var, num);
                if(!retval) {
                    return std::string("Failed parsing number (") + var + ')';
                }
                if(num < 0 || num > 255) {
                    return std::string("Each IP number must be between 0 and 255 ") + var;
                }
            }
            return std::string();
        };
    }